

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O2

void ComputeEmitterChannelCoefficients
               (ConfigInfo *curConfig,F3DAUDIO_BASIS *listenerBasis,float innerRadius,
               F3DAUDIO_VECTOR channelPosition,float attenuation,float LFEattenuation,uint32_t flags
               ,uint32_t currentChannel,uint32_t numSrcChannels,float *pMatrixCoefficients)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  byte skipCenter;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  SpeakerInfo *infos [2];
  
  skipCenter = (byte)(flags >> 0x10) & 1;
  fVar7 = (listenerBasis->top).x;
  fVar9 = (listenerBasis->top).y;
  fVar12 = (listenerBasis->top).z;
  fVar11 = fVar12 * channelPosition.z + fVar7 * channelPosition.x + channelPosition.y * fVar9;
  fVar8 = channelPosition.x - fVar7 * fVar11;
  fVar13 = channelPosition.y - fVar9 * fVar11;
  fVar9 = channelPosition.z - fVar11 * fVar12;
  fVar7 = (float)SDL_sqrtf(fVar9 * fVar9 + fVar8 * fVar8 + fVar13 * fVar13);
  if (fVar7 <= 1e-07) {
    fVar11 = 1.0;
    fVar10 = 0.0;
    fVar12 = 0.0;
LAB_001098f7:
    uVar4 = curConfig->numNonLFSpeakers;
    uVar2 = (ulong)uVar4;
    if ((flags & 0x10000) == 0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar4 = uVar4 - 1;
      uVar3 = curConfig->speakers->matrixIdx;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = curConfig->speakers[uVar5].matrixIdx;
      if (((flags >> 0x10 & 1) == 0) || (uVar1 != uVar3)) {
        uVar6 = uVar1 * numSrcChannels + currentChannel;
        pMatrixCoefficients[uVar6] =
             pMatrixCoefficients[uVar6] + (fVar11 * attenuation) / (float)uVar4;
      }
    }
LAB_00109993:
    if (fVar12 <= 0.0) goto LAB_00109aed;
  }
  else {
    if (innerRadius <= 4e-07) {
      innerRadius = 4e-07;
    }
    fVar7 = fVar7 / innerRadius;
    if (fVar7 <= 0.5) {
      fVar11 = 1.0 - (fVar7 + fVar7);
      fVar12 = fVar11 * 0.0 + (fVar7 + fVar7) * 0.707107;
      fVar10 = (1.0 - fVar11) - fVar12;
      if (0.0 < fVar11) goto LAB_001098f7;
      goto LAB_00109993;
    }
    fVar10 = 0.0;
    fVar12 = 1.0;
    if (fVar7 <= 1.0) {
      fVar12 = fVar7 + -0.5 + fVar7 + -0.5;
      fVar12 = (1.0 - fVar12) * 0.707107 + fVar12;
      fVar10 = 1.0 - fVar12;
      goto LAB_00109993;
    }
  }
  fVar7 = (float)SDL_atan2f((listenerBasis->right).z * fVar9 +
                            (listenerBasis->right).x * fVar8 + (listenerBasis->right).y * fVar13,
                            (listenerBasis->front).z * fVar9 +
                            (listenerBasis->front).x * fVar8 + (listenerBasis->front).y * fVar13);
  fVar11 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar7 |
                  (uint)(fVar7 + 6.2831855) & -(uint)(fVar7 < 0.0));
  FindSpeakerAzimuths(curConfig,fVar11,skipCenter,infos);
  fVar7 = infos[0]->azimuth;
  if (infos[1]->azimuth < fVar7) {
    fVar11 = (float)(-(uint)(fVar11 < fVar7) & (uint)fVar11 |
                    ~-(uint)(fVar11 < fVar7) & (uint)(fVar11 + -6.2831855));
    fVar7 = fVar7 + -6.2831855;
  }
  fVar7 = (fVar11 - fVar7) / (infos[1]->azimuth - fVar7);
  uVar4 = infos[0]->matrixIdx * numSrcChannels + currentChannel;
  uVar3 = infos[1]->matrixIdx;
  pMatrixCoefficients[uVar4] = (1.0 - fVar7) * fVar12 * attenuation + pMatrixCoefficients[uVar4];
  uVar4 = uVar3 * numSrcChannels + currentChannel;
  pMatrixCoefficients[uVar4] = fVar7 * fVar12 * attenuation + pMatrixCoefficients[uVar4];
LAB_00109aed:
  if (0.0 < fVar10) {
    fVar7 = (float)SDL_atan2f(fVar9 * (listenerBasis->right).z +
                              fVar8 * (listenerBasis->right).x + fVar13 * (listenerBasis->right).y);
    fVar7 = fVar7 + 3.1415927;
    if (0.0 <= fVar7) {
      if (6.2831855 < fVar7) {
        fVar7 = fVar7 + -6.2831855;
      }
    }
    else {
      fVar7 = fVar7 + 6.2831855;
    }
    FindSpeakerAzimuths(curConfig,fVar7,skipCenter,infos);
    fVar9 = infos[0]->azimuth;
    if (infos[1]->azimuth < fVar9) {
      fVar7 = (float)(-(uint)(fVar7 < fVar9) & (uint)fVar7 |
                     ~-(uint)(fVar7 < fVar9) & (uint)(fVar7 + -6.2831855));
      fVar9 = fVar9 + -6.2831855;
    }
    fVar7 = (fVar7 - fVar9) / (infos[1]->azimuth - fVar9);
    uVar4 = infos[0]->matrixIdx * numSrcChannels + currentChannel;
    uVar3 = infos[1]->matrixIdx;
    pMatrixCoefficients[uVar4] = (1.0 - fVar7) * fVar10 * attenuation + pMatrixCoefficients[uVar4];
    uVar4 = uVar3 * numSrcChannels + currentChannel;
    pMatrixCoefficients[uVar4] = fVar7 * fVar10 * attenuation + pMatrixCoefficients[uVar4];
  }
  if ((flags >> 0x11 & 1) != 0) {
    uVar4 = numSrcChannels * curConfig->LFSpeakerIdx + currentChannel;
    pMatrixCoefficients[uVar4] = LFEattenuation / (float)numSrcChannels + pMatrixCoefficients[uVar4]
    ;
  }
  return;
}

Assistant:

static inline void ComputeEmitterChannelCoefficients(
	const ConfigInfo *curConfig,
	const F3DAUDIO_BASIS *listenerBasis,
	float innerRadius,
	F3DAUDIO_VECTOR channelPosition,
	float attenuation,
	float LFEattenuation,
	uint32_t flags,
	uint32_t currentChannel,
	uint32_t numSrcChannels,
	float *pMatrixCoefficients
) {
	float elevation, radialDistance;
	F3DAUDIO_VECTOR projTopVec, projPlane;
	uint8_t skipCenter = (flags & F3DAUDIO_CALCULATE_ZEROCENTER) ? 1 : 0;
	DiffusionSpeakerFactors diffusionFactors = { 0.0f };

	float x, y;
	float emitterAzimuth;
	float energyPerChannel;
	float totalEnergy;
	uint32_t nChannelsToDiffuseTo;
	uint32_t iS, centerChannelIdx = -1;
	const SpeakerInfo* infos[2];
	float a0, a1, val;
	uint32_t i0, i1;

	/* We project against the listener basis' top vector to get the elevation of the
	 * current emitter channel position.
	 */
	elevation = VectorDot(listenerBasis->top, channelPosition);

	/* To obtain the projection in the front-right plane of the listener's basis of the
	 * emitter channel position, we simply remove the projection against the top vector.
	 * The radial distance is then the length of the projected vector.
	 */
	projTopVec = VectorScale(listenerBasis->top, elevation);
	projPlane = VectorSub(channelPosition, projTopVec);
	radialDistance = VectorLength(projPlane);

	ComputeInnerRadiusDiffusionFactors(
		radialDistance,
		innerRadius,
		diffusionFactors
	);

	/* See the ComputeInnerRadiusDiffusionFactors comment above for more context. */
	/* DIFFUSION_SPEAKERS_ALL corresponds to diffusing part of the sound to all of the
	 * speakers, equally. The amount of sound is determined by the float value
	 * diffusionFactors[DIFFUSION_SPEAKERS_ALL]. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_ALL] > 0.0f)
	{
		nChannelsToDiffuseTo = curConfig->numNonLFSpeakers;
		totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_ALL] * attenuation;

		if (skipCenter)
		{
			nChannelsToDiffuseTo -= 1;
			FAudio_assert(curConfig->speakers[0].azimuth == SPEAKER_AZIMUTH_CENTER);
			centerChannelIdx = curConfig->speakers[0].matrixIdx;
		}

		energyPerChannel = totalEnergy / nChannelsToDiffuseTo;

		for (iS = 0; iS < curConfig->numNonLFSpeakers; iS += 1)
		{
			const uint32_t curSpeakerIdx = curConfig->speakers[iS].matrixIdx;
			if (skipCenter && curSpeakerIdx == centerChannelIdx)
			{
				continue;
			}

			pMatrixCoefficients[curSpeakerIdx * numSrcChannels + currentChannel] += energyPerChannel;
		}
	}

	/* DIFFUSION_SPEAKERS_MATCHING corresponds to sending part of the sound to the speakers closest
	 * (in terms of azimuth) to the current position of the emitter. The amount of sound we shoud send
	 * corresponds here to diffusionFactors[DIFFUSION_SPEAKERS_MATCHING].
	 * We use the FindSpeakerAzimuths function to find the speakers that match. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] > 0.0f)
	{
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Now, a critical point: We shouldn't be sending sound to
		 * matching speakers when x and y are close to 0. That's the
		 * contract we get from ComputeInnerRadiusDiffusionFactors,
		 * which checks that we're not too close to the zero distance.
		 * This allows the atan2 calculation to give good results.
		 */

		/* atan2 returns [-PI, PI], but we want [0, 2PI] */
		emitterAzimuth = FAudio_atan2f(y, x);
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	/* DIFFUSION_SPEAKERS_OPPOSITE corresponds to sending part of the sound to the speakers
	 * _opposite_ the ones that are the closest to the current emitter position.
	 * To find these, we simply find the ones that are closest to the current emitter's azimuth + PI
	 * using the FindSpeakerAzimuth function. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] > 0.0f)
	{
		/* This code is similar to the matching speakers code above. */
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Similarly, we expect atan2 to be well behaved here. */
		emitterAzimuth = FAudio_atan2f(y, x);

		/* Opposite speakers lie at azimuth + PI */
		emitterAzimuth += F3DAUDIO_PI;

		/* Normalize to [0; 2PI) range. */
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}
		else if (emitterAzimuth > F3DAUDIO_2PI)
		{
			emitterAzimuth -= F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	if (flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE)
	{
		FAudio_assert(curConfig->LFSpeakerIdx != -1);
		pMatrixCoefficients[curConfig->LFSpeakerIdx * numSrcChannels + currentChannel] += LFEattenuation / numSrcChannels;
	}
}